

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void decode_mt_init(AV1Decoder *pbi)

{
  char *pcVar1;
  byte bVar2;
  AVxWorker *pAVar3;
  ThreadData *thread_data;
  int iVar4;
  AVxWorkerInterface *pAVar5;
  AVxWorker *pAVar6;
  DecWorkerData *pDVar7;
  void *pvVar8;
  size_t size;
  long lVar9;
  long lVar10;
  size_t sVar11;
  
  pAVar5 = aom_get_worker_interface();
  if (pbi->num_workers == 0) {
    iVar4 = pbi->max_threads;
    size = (long)iVar4 * 0x38;
    pAVar6 = (AVxWorker *)aom_malloc(size);
    pbi->tile_workers = pAVar6;
    if (pAVar6 == (AVxWorker *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->tile_workers");
    }
    pDVar7 = (DecWorkerData *)aom_calloc((long)iVar4,0x1b0);
    pbi->thread_data = pDVar7;
    if (pDVar7 == (DecWorkerData *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate pbi->thread_data");
    }
    if (0 < iVar4) {
      lVar9 = 0xe0;
      sVar11 = 0;
      do {
        pAVar3 = pbi->tile_workers;
        pDVar7 = pbi->thread_data;
        pAVar6 = (AVxWorker *)((long)&pAVar3->impl_ + sVar11);
        (*pAVar5->init)(pAVar6);
        *(char **)((long)&pAVar3->thread_name + sVar11) = "aom tile worker";
        if (sVar11 == 0) {
          pbi->num_workers = pbi->num_workers + 1;
          *(ThreadData **)((long)pDVar7 + lVar9 + -0xe0) = &pbi->td;
        }
        else {
          iVar4 = (*pAVar5->reset)(pAVar6);
          if (iVar4 == 0) {
            aom_internal_error(&pbi->error,AOM_CODEC_ERROR,"Tile decoder thread creation failed");
          }
          pbi->num_workers = pbi->num_workers + 1;
          pvVar8 = aom_memalign(0x20,0x3ebe0);
          *(void **)((long)pDVar7 + lVar9 + -0xe0) = pvVar8;
          if (pvVar8 == (void *)0x0) {
            aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to allocate thread_data->td");
          }
          memset(*(void **)((long)pDVar7 + lVar9 + -0xe0),0,0x3ebe0);
        }
        *(undefined4 *)((long)pDVar7 + lVar9 + -0xd0) = 0;
        pcVar1 = (pDVar7->error_info).detail + lVar9 + -0x18;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        sVar11 = sVar11 + 0x38;
        lVar9 = lVar9 + 0x1b0;
      } while (size != sVar11);
    }
  }
  bVar2 = ((pbi->common).seq_params)->use_highbitdepth;
  iVar4 = 0x11040 << (bVar2 & 0x1f);
  if (1 < pbi->max_threads) {
    lVar9 = 1;
    lVar10 = 0x1b0;
    do {
      pDVar7 = pbi->thread_data;
      thread_data = *(ThreadData **)((pDVar7->error_info).detail + lVar10 + -0x18);
      if (thread_data->mc_buf_size != iVar4) {
        av1_free_mc_tmp_buf(thread_data);
        allocate_mc_tmp_buf(&pbi->common,
                            *(ThreadData **)((pDVar7->error_info).detail + lVar10 + -0x18),iVar4,
                            (uint)bVar2);
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x1b0;
    } while (lVar9 < pbi->max_threads);
  }
  return;
}

Assistant:

static inline void decode_mt_init(AV1Decoder *pbi) {
  AV1_COMMON *const cm = &pbi->common;
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int worker_idx;

  // Create workers and thread_data
  if (pbi->num_workers == 0) {
    const int num_threads = pbi->max_threads;
    CHECK_MEM_ERROR(cm, pbi->tile_workers,
                    aom_malloc(num_threads * sizeof(*pbi->tile_workers)));
    CHECK_MEM_ERROR(cm, pbi->thread_data,
                    aom_calloc(num_threads, sizeof(*pbi->thread_data)));

    for (worker_idx = 0; worker_idx < num_threads; ++worker_idx) {
      AVxWorker *const worker = &pbi->tile_workers[worker_idx];
      DecWorkerData *const thread_data = pbi->thread_data + worker_idx;

      winterface->init(worker);
      worker->thread_name = "aom tile worker";
      if (worker_idx != 0 && !winterface->reset(worker)) {
        aom_internal_error(&pbi->error, AOM_CODEC_ERROR,
                           "Tile decoder thread creation failed");
      }
      ++pbi->num_workers;

      if (worker_idx != 0) {
        // Allocate thread data.
        CHECK_MEM_ERROR(cm, thread_data->td,
                        aom_memalign(32, sizeof(*thread_data->td)));
        av1_zero(*thread_data->td);
      } else {
        // Main thread acts as a worker and uses the thread data in pbi
        thread_data->td = &pbi->td;
      }
      thread_data->error_info.error_code = AOM_CODEC_OK;
      thread_data->error_info.setjmp = 0;
    }
  }
  const int use_highbd = cm->seq_params->use_highbitdepth;
  const int buf_size = MC_TEMP_BUF_PELS << use_highbd;
  for (worker_idx = 1; worker_idx < pbi->max_threads; ++worker_idx) {
    DecWorkerData *const thread_data = pbi->thread_data + worker_idx;
    if (thread_data->td->mc_buf_size != buf_size) {
      av1_free_mc_tmp_buf(thread_data->td);
      allocate_mc_tmp_buf(cm, thread_data->td, buf_size, use_highbd);
    }
  }
}